

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcp_server.cpp
# Opt level: O1

HT_Boolean ht_tcp_server_write_to_socket(HT_TCPServer *server,int sock_fd,char *buffer,size_t size)

{
  uint uVar1;
  ssize_t sVar2;
  ulong uVar3;
  ulong uVar4;
  HT_Boolean HVar5;
  
  if (size == 0) {
LAB_0010a20d:
    HVar5 = 1;
  }
  else {
    uVar4 = 0;
    do {
      if (size < uVar4 || size - uVar4 == 0) goto LAB_0010a20d;
      HVar5 = 0;
      sVar2 = send(sock_fd,buffer + uVar4,size - uVar4,0);
      uVar1 = (uint)sVar2;
      uVar3 = (ulong)(uVar1 & 0x7fffffff);
      if ((int)uVar1 < 1) {
        uVar3 = 0;
      }
      uVar4 = uVar4 + uVar3;
    } while (0 < (int)uVar1);
  }
  return HVar5;
}

Assistant:

HT_Boolean
ht_tcp_server_write_to_socket(HT_TCPServer* server, int sock_fd, char* buffer, size_t size)
{
    (void) server;
    if (size == 0)
    {
        return HT_TRUE;
    }

    size_t sent = 0;

    while (sent < size)
    {
        int n = send(sock_fd, buffer + sent, size - sent, 0);

        if (n <= 0)
        {
            return HT_FALSE;
        }

        sent += n;
    }

    return HT_TRUE;
}